

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.cpp
# Opt level: O2

void ggml_vec_dot_f32(int n,float *s,size_t bs,float *x,size_t bx,float *y,size_t by,int nrc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  long lVar4;
  long lVar5;
  long lVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  
  lVar4 = (long)(int)(n & 0xffffffc0);
  local_c0 = 0;
  uStack_b8 = 0;
  uStack_b0 = 0;
  uStack_a8 = 0;
  uStack_a0 = 0;
  uStack_98 = 0;
  uStack_90 = 0;
  uStack_88 = 0;
  local_100 = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  uStack_e0 = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  uStack_c8 = 0;
  local_140 = 0;
  uStack_138 = 0;
  uStack_130 = 0;
  uStack_128 = 0;
  uStack_120 = 0;
  uStack_118 = 0;
  uStack_110 = 0;
  uStack_108 = 0;
  local_180 = 0;
  uStack_178 = 0;
  uStack_170 = 0;
  uStack_168 = 0;
  uStack_160 = 0;
  uStack_158 = 0;
  uStack_150 = 0;
  uStack_148 = 0;
  pfVar7 = x;
  pfVar8 = y;
  for (lVar5 = 0; lVar5 < lVar4; lVar5 = lVar5 + 0x40) {
    for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 0x40) {
      auVar10 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)pfVar8 + lVar6),
                                    *(undefined1 (*) [64])((long)pfVar7 + lVar6),
                                    *(undefined1 (*) [64])((long)&local_180 + lVar6));
      *(undefined1 (*) [64])((long)&local_180 + lVar6) = auVar10;
    }
    pfVar8 = pfVar8 + 0x40;
    pfVar7 = pfVar7 + 0x40;
  }
  auVar10._8_8_ = uStack_178;
  auVar10._0_8_ = local_180;
  auVar10._16_8_ = uStack_170;
  auVar10._24_8_ = uStack_168;
  auVar10._32_8_ = uStack_160;
  auVar10._40_8_ = uStack_158;
  auVar10._48_8_ = uStack_150;
  auVar10._56_8_ = uStack_148;
  auVar11._8_8_ = uStack_138;
  auVar11._0_8_ = local_140;
  auVar11._16_8_ = uStack_130;
  auVar11._24_8_ = uStack_128;
  auVar11._32_8_ = uStack_120;
  auVar11._40_8_ = uStack_118;
  auVar11._48_8_ = uStack_110;
  auVar11._56_8_ = uStack_108;
  auVar2._8_8_ = uStack_f8;
  auVar2._0_8_ = local_100;
  auVar2._16_8_ = uStack_f0;
  auVar2._24_8_ = uStack_e8;
  auVar2._32_8_ = uStack_e0;
  auVar2._40_8_ = uStack_d8;
  auVar2._48_8_ = uStack_d0;
  auVar2._56_8_ = uStack_c8;
  auVar10 = vaddps_avx512f(auVar10,auVar2);
  auVar3._8_8_ = uStack_b8;
  auVar3._0_8_ = local_c0;
  auVar3._16_8_ = uStack_b0;
  auVar3._24_8_ = uStack_a8;
  auVar3._32_8_ = uStack_a0;
  auVar3._40_8_ = uStack_98;
  auVar3._48_8_ = uStack_90;
  auVar3._56_8_ = uStack_88;
  auVar11 = vaddps_avx512f(auVar11,auVar3);
  auVar10 = vaddps_avx512f(auVar10,auVar11);
  auVar9 = vextractf64x4_avx512f(auVar10,1);
  auVar10 = vaddps_avx512f(auVar10,ZEXT3264(auVar9));
  auVar12._0_4_ = auVar10._0_4_ + auVar10._16_4_;
  auVar12._4_4_ = auVar10._4_4_ + auVar10._20_4_;
  auVar12._8_4_ = auVar10._8_4_ + auVar10._24_4_;
  auVar12._12_4_ = auVar10._12_4_ + auVar10._28_4_;
  auVar1 = vshufpd_avx(auVar12,auVar12,1);
  auVar13._0_4_ = auVar12._0_4_ + auVar1._0_4_;
  auVar13._4_4_ = auVar12._4_4_ + auVar1._4_4_;
  auVar13._8_4_ = auVar12._8_4_ + auVar1._8_4_;
  auVar13._12_4_ = auVar12._12_4_ + auVar1._12_4_;
  auVar1 = vhaddps_avx(auVar13,auVar13);
  for (; lVar4 < n; lVar4 = lVar4 + 1) {
    auVar1 = vfmadd231ss_fma(auVar1,ZEXT416((uint)x[lVar4]),ZEXT416((uint)y[lVar4]));
  }
  *s = auVar1._0_4_;
  return;
}

Assistant:

void ggml_vec_dot_f32(int n, float * GGML_RESTRICT s, size_t bs, const float * GGML_RESTRICT x, size_t bx, const float * GGML_RESTRICT y, size_t by, int nrc) {
   assert(nrc == 1);
   GGML_UNUSED(nrc);
   GGML_UNUSED(bx);
   GGML_UNUSED(by);
   GGML_UNUSED(bs);

#if defined(GGML_SIMD)
    float sumf = 0.0f;
    const int np = (n & ~(GGML_F32_STEP - 1));

    GGML_F32_VEC sum[GGML_F32_ARR] = { GGML_F32_VEC_ZERO };

    GGML_F32_VEC ax[GGML_F32_ARR];
    GGML_F32_VEC ay[GGML_F32_ARR];

    for (int i = 0; i < np; i += GGML_F32_STEP) {
        for (int j = 0; j < GGML_F32_ARR; j++) {
            ax[j] = GGML_F32_VEC_LOAD(x + i + j*GGML_F32_EPR);
            ay[j] = GGML_F32_VEC_LOAD(y + i + j*GGML_F32_EPR);

            sum[j] = GGML_F32_VEC_FMA(sum[j], ax[j], ay[j]);
        }
    }

    // reduce sum0..sum3 to sum0
    GGML_F32_VEC_REDUCE(sumf, sum);

    // leftovers
    for (int i = np; i < n; ++i) {
        sumf += x[i]*y[i];
    }
#else
    // scalar
    ggml_float sumf = 0.0;
    for (int i = 0; i < n; ++i) {
        sumf += (ggml_float)(x[i]*y[i]);
    }
#endif

    *s = sumf;
}